

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-misc.c
# Opt level: O0

void do_cmd_time(void)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  uint local_28;
  wchar_t min;
  wchar_t hour;
  wchar_t day;
  int32_t tick;
  int32_t len;
  
  uVar2 = (uint)z_info->day_length * 10;
  iVar3 = turn % (int)uVar2 + uVar2 / 4;
  uVar1 = (long)(iVar3 * 0x18) / (long)(int)uVar2;
  iVar4 = (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % 0x18);
  uVar1 = (long)(iVar3 * 0x5a0) / (long)(int)uVar2;
  if (iVar4 % 0xc == 0) {
    local_28 = 0xc;
  }
  else {
    local_28 = iVar4 % 0xc;
  }
  pcVar5 = "PM";
  if (iVar4 < 0xc) {
    pcVar5 = "AM";
  }
  msg("This is day %d. The time is %d:%02d %s.",(ulong)(turn / (int)uVar2 + 1),(ulong)local_28,
      (long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % 0x3c & 0xffffffff,
      pcVar5);
  return;
}

Assistant:

void do_cmd_time(void)
{
	int32_t len = 10L * z_info->day_length;
	int32_t tick = turn % len + len / 4;

	int day = turn / len + 1;
	int hour = (24 * tick / len) % 24;
	int min = (1440 * tick / len) % 60;


	/* Message */
	msg("This is day %d. The time is %d:%02d %s.", day,
		(hour % 12 == 0) ? 12 : (hour % 12), min,
		(hour < 12) ? "AM" : "PM");
}